

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSortByPType.cpp
# Opt level: O2

void __thiscall SortByPTypeProcessTest::SetUp(SortByPTypeProcessTest *this)

{
  int *piVar1;
  SortByPTypeProcessTest *pSVar2;
  bool bVar3;
  SortByPTypeProcess *this_00;
  aiScene *this_01;
  aiMesh **ppaVar4;
  aiMesh *this_02;
  undefined8 *puVar5;
  long lVar6;
  aiVector3D *paVar7;
  aiVector3D *__s;
  aiVector3D *__s_00;
  aiVector3D *__s_01;
  aiVector3D *__s_02;
  uint *puVar8;
  ulong uVar9;
  aiNode *paVar10;
  aiNode **ppaVar11;
  uint uVar12;
  long lVar13;
  aiFace *paVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  undefined8 local_58;
  undefined8 uStack_50;
  SortByPTypeProcessTest *local_40;
  aiVector3D *local_38;
  
  this_00 = (SortByPTypeProcess *)operator_new(0x20);
  Assimp::SortByPTypeProcess::SortByPTypeProcess(this_00);
  this->mProcess1 = this_00;
  this_01 = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this_01);
  this->mScene = this_01;
  this_01->mNumMeshes = 10;
  ppaVar4 = (aiMesh **)operator_new__(0x50);
  this_01->mMeshes = ppaVar4;
  bVar3 = false;
  local_40 = this;
  for (lVar13 = 0; pSVar2 = local_40, lVar13 != 10; lVar13 = lVar13 + 1) {
    this_02 = (aiMesh *)operator_new(0x520);
    aiMesh::aiMesh(this_02);
    pSVar2->mScene->mMeshes[lVar13] = this_02;
    this_02->mNumFaces = 1000;
    puVar5 = (undefined8 *)operator_new__(0x3e88);
    *puVar5 = 1000;
    lVar6 = 0x10;
    do {
      *(undefined4 *)((long)puVar5 + lVar6 + -8) = 0;
      *(undefined8 *)((long)puVar5 + lVar6) = 0;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x3e90);
    paVar14 = (aiFace *)(puVar5 + 1);
    this_02->mFaces = paVar14;
    paVar7 = (aiVector3D *)operator_new__(60000);
    memset(paVar7,0,60000);
    this_02->mVertices = paVar7;
    __s = (aiVector3D *)operator_new__(60000);
    memset(__s,0,60000);
    this_02->mNormals = __s;
    __s_00 = (aiVector3D *)operator_new__(60000);
    memset(__s_00,0,60000);
    this_02->mTangents = __s_00;
    __s_01 = (aiVector3D *)operator_new__(60000);
    memset(__s_01,0,60000);
    this_02->mBitangents = __s_01;
    __s_02 = (aiVector3D *)operator_new__(60000);
    memset(__s_02,0,60000);
    uVar15 = 0;
    this_02->mTextureCoords[0] = __s_02;
    local_58 = *(undefined8 *)::num[lVar13];
    uStack_50 = *(undefined8 *)(::num[lVar13] + 2);
    for (uVar12 = 0; uVar12 != 1000; uVar12 = uVar12 + 1) {
      uVar17 = uVar12 & 3;
      while (uVar18 = (ulong)uVar17, *(int *)((long)&local_58 + uVar18 * 4) == 0) {
        uVar17 = uVar17 + 1;
        if (uVar17 == 4) {
          uVar17 = 0;
        }
      }
      uVar17 = uVar17 + 1;
      uVar16 = (ulong)uVar17;
      paVar14->mNumIndices = uVar17;
      if (uVar17 == 4) {
        uVar16 = 4;
        if (bVar3) {
          paVar14->mNumIndices = 5;
          uVar16 = 5;
        }
        bVar3 = (bool)(bVar3 ^ 1);
      }
      local_38 = paVar7;
      puVar8 = (uint *)operator_new__(uVar16 << 2);
      paVar7 = local_38;
      paVar14->mIndices = puVar8;
      lVar6 = 0;
      for (uVar9 = 0; uVar9 < uVar16; uVar9 = uVar9 + 1) {
        paVar14->mIndices[uVar9] = uVar15 + (int)uVar9;
        fVar19 = (float)*(uint *)((long)&local_58 + uVar18 * 4);
        fVar20 = (float)(uVar9 & 0xffffffff) + fVar19;
        *(float *)((long)&local_38->x + lVar6) = fVar19;
        *(float *)((long)&__s->x + lVar6) = fVar19;
        *(float *)((long)&__s_00->x + lVar6) = fVar19;
        *(float *)((long)&__s_01->x + lVar6) = fVar19;
        *(float *)((long)&__s_02->x + lVar6) = fVar19;
        fVar19 = fVar19 + 1.0;
        *(float *)((long)&local_38->y + lVar6) = fVar19;
        *(float *)((long)&local_38->z + lVar6) = fVar20;
        *(float *)((long)&__s->y + lVar6) = fVar19;
        *(float *)((long)&__s->z + lVar6) = fVar20;
        *(float *)((long)&__s_00->y + lVar6) = fVar19;
        *(float *)((long)&__s_00->z + lVar6) = fVar20;
        *(float *)((long)&__s_01->y + lVar6) = fVar19;
        *(float *)((long)&__s_01->z + lVar6) = fVar20;
        *(float *)((long)&__s_02->y + lVar6) = fVar19;
        *(float *)((long)&__s_02->z + lVar6) = fVar20;
        uVar16 = (ulong)paVar14->mNumIndices;
        lVar6 = lVar6 + 0xc;
      }
      piVar1 = (int *)((long)&local_58 + uVar18 * 4);
      *piVar1 = *piVar1 + -1;
      paVar14 = paVar14 + 1;
      paVar7 = (aiVector3D *)((long)&paVar7->x + lVar6);
      __s = (aiVector3D *)((long)&__s->x + lVar6);
      __s_00 = (aiVector3D *)((long)&__s_00->x + lVar6);
      __s_01 = (aiVector3D *)((long)&__s_01->x + lVar6);
      __s_02 = (aiVector3D *)((long)&__s_02->x + lVar6);
      uVar15 = uVar15 + (int)uVar9;
    }
    this_02->mNumVertices = uVar15;
  }
  paVar10 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar10);
  pSVar2->mScene->mRootNode = paVar10;
  pSVar2->mScene->mRootNode->mNumChildren = 5;
  ppaVar11 = (aiNode **)operator_new__(0x28);
  pSVar2->mScene->mRootNode->mChildren = ppaVar11;
  for (lVar13 = 0; lVar13 != 10; lVar13 = lVar13 + 2) {
    paVar10 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar10);
    *(aiNode **)((long)pSVar2->mScene->mRootNode->mChildren + lVar13 * 4) = paVar10;
    paVar10->mNumMeshes = 2;
    puVar8 = (uint *)operator_new__(8);
    paVar10->mMeshes = puVar8;
    *puVar8 = (uint)lVar13;
    puVar8[1] = (uint)lVar13 + 1;
  }
  return;
}

Assistant:

void SortByPTypeProcessTest::SetUp() {
    mProcess1 = new SortByPTypeProcess();
    mScene = new aiScene();

    mScene->mNumMeshes = 10;
    mScene->mMeshes = new aiMesh*[10];

    bool five = false;
    for (unsigned int i = 0; i < 10; ++i) {
        aiMesh* mesh = mScene->mMeshes[i] = new aiMesh();
        mesh->mNumFaces = 1000;
        aiFace* faces =  mesh->mFaces = new aiFace[1000];
        aiVector3D* pv = mesh->mVertices = new aiVector3D[mesh->mNumFaces*5];
        aiVector3D* pn = mesh->mNormals = new aiVector3D[mesh->mNumFaces*5];

        aiVector3D* pt = mesh->mTangents = new aiVector3D[mesh->mNumFaces*5];
        aiVector3D* pb = mesh->mBitangents = new aiVector3D[mesh->mNumFaces*5];

        aiVector3D* puv = mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumFaces*5];

        unsigned int remaining[4] = {num[i][0],num[i][1],num[i][2],num[i][3]};
        unsigned int n = 0;
        for (unsigned int m = 0; m < 1000; ++m) {
            unsigned int idx = m % 4;
            while (true) {
                if (!remaining[idx]) {
                    if (4 == ++idx) {
                        idx = 0;
                    }
                    continue;
                }
                break;
            }
            faces->mNumIndices = idx+1;
            if (4 == faces->mNumIndices) {
                if(five)++faces->mNumIndices;
                five = !five;
            }
            faces->mIndices = new unsigned int[faces->mNumIndices];
            for (unsigned int q = 0; q <faces->mNumIndices;++q,++n) {
                faces->mIndices[q] = n;
                float f = (float)remaining[idx];

                // (the values need to be unique - otherwise all degenerates would be removed)
                *pv++ = aiVector3D(f,f+1.f,f+q);
                *pn++ = aiVector3D(f,f+1.f,f+q);
                *pt++ = aiVector3D(f,f+1.f,f+q);
                *pb++ = aiVector3D(f,f+1.f,f+q);
                *puv++ = aiVector3D(f,f+1.f,f+q);
            }
            ++faces;
            --remaining[idx];
        }
        mesh->mNumVertices = n;
    }

    mScene->mRootNode = new aiNode();
    mScene->mRootNode->mNumChildren = 5;
    mScene->mRootNode->mChildren = new aiNode*[5];
    for (unsigned int i = 0; i< 5;++i ) {
        aiNode* node = mScene->mRootNode->mChildren[i] = new aiNode();
        node->mNumMeshes = 2;
        node->mMeshes = new unsigned int[2];
        node->mMeshes[0] = (i<<1u);
        node->mMeshes[1] = (i<<1u)+1;
    }
}